

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O2

uint64_t sx_tm_laptime(uint64_t *last_ticks)

{
  ulong uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  
  if (last_ticks != (uint64_t *)0x0) {
    uVar2 = stm_now();
    uVar1 = *last_ticks;
    *last_ticks = uVar2;
    uVar3 = 1;
    if (uVar1 <= uVar2 && uVar2 - uVar1 != 0) {
      uVar3 = uVar2 - uVar1;
    }
    if (uVar1 == 0) {
      uVar3 = 0;
    }
    return uVar3;
  }
  __assert_fail("last_time",
                "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/sokol/sokol_time.h"
                ,0x105,"uint64_t stm_laptime(uint64_t *)");
}

Assistant:

uint64_t sx_tm_laptime(uint64_t* last_ticks)
{
    return stm_laptime(last_ticks);
}